

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.cpp
# Opt level: O0

void test_qclab_dense_SquareMatrix<std::complex<double>>(void)

{
  complex<double> m10;
  complex<double> m02;
  complex<double> m02_00;
  complex<double> m10_00;
  complex<double> m10_01;
  complex<double> m10_02;
  complex<double> m10_03;
  complex<double> m10_04;
  complex<double> m10_05;
  complex<double> m10_06;
  complex<double> m10_07;
  complex<double> m10_08;
  complex<double> m10_09;
  complex<double> m10_10;
  complex<double> m10_11;
  complex<double> m10_12;
  complex<double> m10_13;
  complex<double> m10_14;
  complex<double> m11;
  complex<double> m03;
  complex<double> m03_00;
  complex<double> m11_00;
  complex<double> m11_01;
  complex<double> m11_02;
  complex<double> m11_03;
  complex<double> m11_04;
  complex<double> m11_05;
  complex<double> m11_06;
  complex<double> m11_07;
  complex<double> m11_08;
  complex<double> m11_09;
  complex<double> m11_10;
  complex<double> m11_11;
  complex<double> m11_12;
  complex<double> m11_13;
  complex<double> m11_14;
  complex<double> m10_15;
  complex<double> m10_16;
  complex<double> m11_15;
  complex<double> m11_16;
  complex<double> m12;
  complex<double> m12_00;
  complex<double> m13;
  complex<double> m13_00;
  complex<double> m20;
  complex<double> m20_00;
  complex<double> m21;
  complex<double> m21_00;
  complex<double> m22;
  complex<double> m22_00;
  complex<double> m23;
  complex<double> m23_00;
  complex<double> m30;
  complex<double> m30_00;
  complex<double> m31;
  complex<double> m31_00;
  complex<double> m32;
  complex<double> m32_00;
  complex<double> m33;
  complex<double> m33_00;
  bool bVar1;
  char *pcVar2;
  complex<double> *pcVar3;
  int *piVar4;
  complex<double> *pcVar5;
  long *plVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  Message *pMVar7;
  undefined8 uVar8;
  char *in_R9;
  complex<double> value;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m00_01;
  complex<double> m00_02;
  complex<double> m00_03;
  complex<double> m00_04;
  complex<double> m00_05;
  complex<double> m00_06;
  complex<double> m00_07;
  complex<double> m00_08;
  complex<double> m00_09;
  complex<double> m00_10;
  complex<double> m00_11;
  complex<double> m00_12;
  complex<double> m00_13;
  complex<double> m00_14;
  complex<double> m00_15;
  complex<double> m00_16;
  complex<double> m01;
  complex<double> m01_00;
  complex<double> m01_01;
  complex<double> m01_02;
  complex<double> m01_03;
  complex<double> m01_04;
  complex<double> m01_05;
  complex<double> m01_06;
  complex<double> m01_07;
  complex<double> m01_08;
  complex<double> m01_09;
  complex<double> m01_10;
  complex<double> m01_11;
  complex<double> m01_12;
  complex<double> m01_13;
  complex<double> m01_14;
  complex<double> m01_15;
  complex<double> m01_16;
  undefined8 in_stack_ffffffffffffdbb8;
  undefined8 uVar9;
  undefined8 in_stack_ffffffffffffdbc0;
  undefined8 uVar10;
  undefined8 in_stack_ffffffffffffdbc8;
  undefined8 uVar11;
  undefined8 in_stack_ffffffffffffdbd0;
  undefined8 uVar12;
  unkbyte10 in_stack_ffffffffffffdc78;
  undefined1 in_stack_ffffffffffffdc82;
  undefined1 in_stack_ffffffffffffdc83;
  undefined1 in_stack_ffffffffffffdc84;
  undefined1 in_stack_ffffffffffffdc85;
  undefined1 in_stack_ffffffffffffdc86;
  undefined1 in_stack_ffffffffffffdc87;
  undefined8 in_stack_ffffffffffffdc88;
  undefined8 in_stack_ffffffffffffdc90;
  string local_1f28;
  AssertHelper local_1f08;
  Message local_1f00;
  bool local_1ef1;
  undefined1 local_1ef0 [8];
  AssertionResult gtest_ar__36;
  complex<double> local_1ed0;
  complex<double> local_1ec0;
  complex<double> local_1eb0;
  undefined1 local_1ea0 [8];
  SquareMatrix<std::complex<double>_> I_check;
  SquareMatrix<std::complex<double>_> I;
  AssertHelper local_1e60;
  Message local_1e58;
  bool local_1e49;
  undefined1 local_1e48 [8];
  AssertionResult gtest_ar__35;
  complex<double> local_1e28;
  complex<double> local_1e18;
  complex<double> local_1e08;
  undefined1 local_1df8 [8];
  SquareMatrix<std::complex<double>_> Z_check;
  SquareMatrix<std::complex<double>_> Z;
  AssertHelper local_1db8;
  Message local_1db0;
  bool local_1da1;
  undefined1 local_1da0 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_1d70;
  Message local_1d68;
  bool local_1d59;
  undefined1 local_1d58 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_1d28;
  Message local_1d20;
  bool local_1d11;
  undefined1 local_1d10 [8];
  AssertionResult gtest_ar__32;
  SquareMatrix<std::complex<double>_> prod;
  AssertHelper local_1cd0;
  Message local_1cc8;
  bool local_1cb9;
  undefined1 local_1cb8 [8];
  AssertionResult gtest_ar__31;
  Message local_1ca0;
  int local_1c94;
  int64_t local_1c90;
  undefined1 local_1c88 [8];
  AssertionResult gtest_ar_58;
  SquareMatrix<std::complex<double>_> local_1c68;
  SquareMatrix<std::complex<double>_> local_1c58;
  undefined1 local_1c48 [8];
  SquareMatrix<std::complex<double>_> prodABCD;
  AssertHelper local_1c18;
  Message local_1c10;
  bool local_1c01;
  undefined1 local_1c00 [8];
  AssertionResult gtest_ar__30;
  Message local_1be8;
  int local_1bdc;
  int64_t local_1bd8;
  undefined1 local_1bd0 [8];
  AssertionResult gtest_ar_57;
  SquareMatrix<std::complex<double>_> local_1bb0;
  undefined1 local_1ba0 [8];
  SquareMatrix<std::complex<double>_> prodABC;
  AssertHelper local_1b70;
  Message local_1b68;
  bool local_1b59;
  undefined1 local_1b58 [8];
  AssertionResult gtest_ar__29;
  Message local_1b40;
  int local_1b34;
  int64_t local_1b30;
  undefined1 local_1b28 [8];
  AssertionResult gtest_ar_56;
  undefined1 local_1b08 [8];
  SquareMatrix<std::complex<double>_> prodAB;
  complex<double> local_1ae8;
  complex<double> local_1ad8;
  complex<double> local_1ac8;
  undefined1 local_1ab8 [8];
  SquareMatrix<std::complex<double>_> prodABCD_check;
  complex<double> local_1a98;
  complex<double> local_1a88;
  complex<double> local_1a78;
  undefined1 local_1a68 [8];
  SquareMatrix<std::complex<double>_> prodABC_check;
  complex<double> local_1a48;
  complex<double> local_1a38;
  complex<double> local_1a28;
  undefined1 local_1a18 [8];
  SquareMatrix<std::complex<double>_> prodAB_check;
  AssertHelper local_19e8;
  Message local_19e0;
  undefined1 local_19d1 [9];
  AssertionResult gtest_ar__28;
  AssertHelper local_19a0;
  Message local_1998;
  bool local_1989;
  undefined1 local_1988 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_1958;
  Message local_1950;
  bool local_1941;
  undefined1 local_1940 [8];
  AssertionResult gtest_ar__26;
  SquareMatrix<std::complex<double>_> minus;
  AssertHelper local_1900;
  Message local_18f8;
  bool local_18e9;
  undefined1 local_18e8 [8];
  AssertionResult gtest_ar__25;
  Message local_18d0;
  int local_18c4;
  int64_t local_18c0;
  undefined1 local_18b8 [8];
  AssertionResult gtest_ar_55;
  SquareMatrix<std::complex<double>_> local_1898;
  SquareMatrix<std::complex<double>_> local_1888;
  undefined1 local_1878 [8];
  SquareMatrix<std::complex<double>_> minusABCD;
  AssertHelper local_1848;
  Message local_1840;
  bool local_1831;
  undefined1 local_1830 [8];
  AssertionResult gtest_ar__24;
  Message local_1818;
  int local_180c;
  int64_t local_1808;
  undefined1 local_1800 [8];
  AssertionResult gtest_ar_54;
  SquareMatrix<std::complex<double>_> local_17e0;
  undefined1 local_17d0 [8];
  SquareMatrix<std::complex<double>_> minusABC;
  AssertHelper local_17a0;
  Message local_1798;
  bool local_1789;
  undefined1 local_1788 [8];
  AssertionResult gtest_ar__23;
  Message local_1770;
  int local_1764;
  int64_t local_1760;
  undefined1 local_1758 [8];
  AssertionResult gtest_ar_53;
  undefined1 local_1738 [8];
  SquareMatrix<std::complex<double>_> minusAB;
  complex<double> local_1718;
  complex<double> local_1708;
  complex<double> local_16f8;
  undefined1 local_16e8 [8];
  SquareMatrix<std::complex<double>_> minusABCD_check;
  complex<double> local_16c8;
  complex<double> local_16b8;
  complex<double> local_16a8;
  undefined1 local_1698 [8];
  SquareMatrix<std::complex<double>_> minusABC_check;
  complex<double> local_1678;
  complex<double> local_1668;
  complex<double> local_1658;
  undefined1 local_1648 [8];
  SquareMatrix<std::complex<double>_> minusAB_check;
  AssertHelper local_1618;
  Message local_1610;
  undefined1 local_1601 [9];
  AssertionResult gtest_ar__22;
  AssertHelper local_15d0;
  Message local_15c8;
  bool local_15b9;
  undefined1 local_15b8 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_1588;
  Message local_1580;
  bool local_1571;
  undefined1 local_1570 [8];
  AssertionResult gtest_ar__20;
  SquareMatrix<std::complex<double>_> sum;
  AssertHelper local_1530;
  Message local_1528;
  bool local_1519;
  undefined1 local_1518 [8];
  AssertionResult gtest_ar__19;
  Message local_1500;
  int local_14f4;
  int64_t local_14f0;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_52;
  SquareMatrix<std::complex<double>_> local_14c8;
  SquareMatrix<std::complex<double>_> local_14b8;
  undefined1 local_14a8 [8];
  SquareMatrix<std::complex<double>_> sumABCD;
  AssertHelper local_1478;
  Message local_1470;
  bool local_1461;
  undefined1 local_1460 [8];
  AssertionResult gtest_ar__18;
  Message local_1448;
  int local_143c;
  int64_t local_1438;
  undefined1 local_1430 [8];
  AssertionResult gtest_ar_51;
  SquareMatrix<std::complex<double>_> local_1410;
  undefined1 local_1400 [8];
  SquareMatrix<std::complex<double>_> sumABC;
  AssertHelper local_13d0;
  Message local_13c8;
  bool local_13b9;
  undefined1 local_13b8 [8];
  AssertionResult gtest_ar__17;
  Message local_13a0;
  int local_1394;
  int64_t local_1390;
  undefined1 local_1388 [8];
  AssertionResult gtest_ar_50;
  undefined1 local_1368 [8];
  SquareMatrix<std::complex<double>_> sumAB;
  complex<double> local_1348;
  complex<double> local_1338;
  complex<double> local_1328;
  undefined1 local_1318 [8];
  SquareMatrix<std::complex<double>_> sumABCD_check;
  complex<double> local_12f8;
  complex<double> local_12e8;
  complex<double> local_12d8;
  undefined1 local_12c8 [8];
  SquareMatrix<std::complex<double>_> sumABC_check;
  complex<double> local_12a8;
  complex<double> local_1298;
  complex<double> local_1288;
  undefined1 local_1278 [8];
  SquareMatrix<std::complex<double>_> sumAB_check;
  complex<double> local_1258;
  complex<double> local_1248;
  complex<double> local_1238;
  undefined1 local_1228 [8];
  SquareMatrix<std::complex<double>_> D;
  complex<double> local_1208;
  complex<double> local_11f8;
  complex<double> local_11e8;
  undefined1 local_11d8 [8];
  SquareMatrix<std::complex<double>_> C;
  complex<double> local_11b8;
  complex<double> local_11a8;
  complex<double> local_1198;
  undefined1 local_1188 [8];
  SquareMatrix<std::complex<double>_> B;
  complex<double> local_1168;
  complex<double> local_1158;
  complex<double> local_1148;
  undefined1 local_1138 [8];
  SquareMatrix<std::complex<double>_> A;
  AssertHelper local_1108;
  Message local_1100;
  undefined1 local_10f1 [9];
  AssertionResult gtest_ar__16;
  AssertHelper local_10c0;
  Message local_10b8;
  bool local_10a9;
  undefined1 local_10a8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_1078;
  Message local_1070;
  bool local_1061;
  undefined1 local_1060 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_1030;
  Message local_1028;
  bool local_1019;
  undefined1 local_1018 [8];
  AssertionResult gtest_ar__13;
  undefined8 uStack_1000;
  complex<double> local_ff8;
  complex<double> local_fe8;
  complex<double> local_fd8;
  complex<double> local_fc8;
  complex<double> local_fb8;
  complex<double> local_fa8;
  complex<double> local_f98;
  complex<double> local_f88;
  complex<double> local_f78;
  complex<double> local_f68;
  complex<double> local_f58;
  complex<double> local_f48;
  complex<double> local_f38;
  complex<double> local_f28;
  complex<double> local_f18;
  undefined1 local_f08 [8];
  SquareMatrix<std::complex<double>_> M5;
  AssertHelper local_ed8;
  Message local_ed0;
  undefined1 local_ec1 [9];
  AssertionResult gtest_ar__12;
  AssertHelper local_e90;
  Message local_e88;
  bool local_e79;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_e48;
  Message local_e40;
  bool local_e31;
  undefined1 local_e30 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_e00;
  Message local_df8;
  bool local_de9;
  undefined1 local_de8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_db8;
  Message local_db0;
  bool local_da1;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_d70;
  Message local_d68;
  bool local_d59;
  undefined1 local_d58 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_d28;
  Message local_d20;
  bool local_d11;
  undefined1 local_d10 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_ce0;
  Message local_cd8;
  bool local_cc9;
  undefined1 local_cc8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_c98;
  Message local_c90;
  bool local_c81;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_c50;
  Message local_c48;
  bool local_c39;
  undefined1 local_c38 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_c08;
  Message local_c00;
  bool local_bf1;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar__2;
  Message local_bd8;
  int local_bcc;
  int64_t local_bc8;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_49;
  Message local_ba8;
  int local_b9c;
  int64_t local_b98;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_48;
  Message local_b78;
  int local_b6c;
  int64_t local_b68;
  undefined1 local_b60 [8];
  AssertionResult gtest_ar_47;
  Message local_b48;
  int local_b3c;
  int64_t local_b38;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_46;
  SquareMatrix<std::complex<double>_> M2copy;
  AssertHelper local_af0;
  Message local_ae8;
  bool local_ad9;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar__1;
  Message local_ac0;
  int local_ab4;
  int64_t local_ab0;
  undefined1 local_aa8 [8];
  AssertionResult gtest_ar_45;
  Message local_a90;
  int local_a84;
  int64_t local_a80;
  undefined1 local_a78 [8];
  AssertionResult gtest_ar_44;
  Message local_a60;
  int local_a54;
  int64_t local_a50;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar_43;
  Message local_a30;
  int local_a24;
  int64_t local_a20;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar_42;
  SquareMatrix<std::complex<double>_> M1copy;
  AssertHelper local_9d8;
  Message local_9d0;
  bool local_9c1;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_;
  Message local_9a8;
  int local_99c;
  int64_t local_998;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_41;
  Message local_978;
  int local_96c;
  int64_t local_968;
  undefined1 local_960 [8];
  AssertionResult gtest_ar_40;
  Message local_948;
  int local_93c;
  int64_t local_938;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_39;
  Message local_918;
  int local_90c;
  int64_t local_908;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_38;
  SquareMatrix<std::complex<double>_> M4copy;
  Message local_8d8;
  complex<double> local_8d0;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_37;
  Message local_8a8;
  complex<double> local_8a0;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_36;
  Message local_878;
  complex<double> local_870;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_35;
  Message local_848;
  complex<double> local_840;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_34;
  Message local_818;
  complex<double> local_810;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_33;
  Message local_7e8;
  complex<double> local_7e0;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_32;
  Message local_7b8;
  complex<double> local_7b0;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_31;
  Message local_788;
  complex<double> local_780;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_30;
  Message local_758;
  complex<double> local_750;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_29;
  Message local_728;
  complex<double> local_720;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_28;
  Message local_6f8;
  complex<double> local_6f0;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_27;
  Message local_6c8;
  complex<double> local_6c0;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_26;
  Message local_698;
  complex<double> local_690;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_25;
  Message local_668;
  complex<double> local_660;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_24;
  Message local_638;
  complex<double> local_630;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_23;
  Message local_608;
  complex<double> local_600;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_22;
  Message local_5d8;
  int local_5cc;
  int64_t local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_21;
  Message local_5a8;
  int local_59c;
  int64_t local_598;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_20;
  Message local_578;
  int local_56c;
  int64_t local_568;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_19;
  Message local_548;
  int local_53c;
  int64_t local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_18;
  undefined8 uStack_518;
  complex<double> local_510;
  complex<double> local_500;
  complex<double> local_4f0;
  complex<double> local_4e0;
  complex<double> local_4d0;
  complex<double> local_4c0;
  complex<double> local_4b0;
  complex<double> local_4a0;
  complex<double> local_490;
  complex<double> local_480;
  complex<double> local_470;
  complex<double> local_460;
  complex<double> local_450;
  complex<double> local_440;
  complex<double> local_430;
  undefined1 local_420 [8];
  SquareMatrix<std::complex<double>_> M4;
  Message local_408;
  complex<double> local_400;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_17;
  Message local_3d8;
  complex<double> local_3d0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_16;
  Message local_3a8;
  complex<double> local_3a0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_15;
  Message local_378;
  complex<double> local_370;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_14;
  Message local_348;
  int local_33c;
  int64_t local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_13;
  Message local_318;
  int local_30c;
  int64_t local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_12;
  Message local_2e8;
  int local_2dc;
  int64_t local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_11;
  Message local_2b8;
  int local_2ac;
  int64_t local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_10;
  complex<double> local_280;
  complex<double> local_270;
  complex<double> local_260;
  undefined1 local_250 [8];
  SquareMatrix<std::complex<double>_> M3;
  Message local_238;
  complex<double> local_230;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_9;
  int j_2;
  int i_2;
  Message local_200;
  undefined1 local_1f4 [12];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_8;
  Message local_1d0;
  int local_1c4;
  int64_t local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_7;
  Message local_1a0;
  int local_194;
  int64_t local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_6;
  Message local_170;
  int local_164;
  int64_t local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_138 [8];
  SquareMatrix<std::complex<double>_> M2;
  Message local_120;
  complex<double> local_118;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  int local_f0;
  int j_1;
  int i_1;
  int j;
  int i;
  int c;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [16];
  AssertionResult gtest_ar_3;
  Message local_a8;
  int local_9c;
  int64_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  int local_6c;
  int64_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  int local_40 [4];
  int64_t local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  SquareMatrix<std::complex<double>_> M1;
  
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_,3);
  local_30 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                       ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  local_40[0] = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_28,"M1.size()","3",&local_30,local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_68 = qclab::dense::SquareMatrix<std::complex<double>_>::rows
                       ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  local_6c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_60,"M1.rows()","3",&local_68,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_98 = qclab::dense::SquareMatrix<std::complex<double>_>::cols
                       ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  local_9c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_90,"M1.cols()","3",&local_98,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8._0_8_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::ld
                 ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  local_cc = 3;
  pcVar5 = (complex<double> *)local_c8;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)(local_c8 + 8),"M1.ld()","3",(long *)pcVar5,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_c8 + 8));
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_c8 + 8));
    pcVar5 = (complex<double> *)0xc;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_c8 + 8));
  j = 0;
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < 3; j_1 = j_1 + 1) {
      pcVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_,(long)i_1,
                          (long)j_1);
      std::complex<double>::operator=(pcVar3,(double)j + 0.5);
      j = j + 1;
    }
  }
  j = 0;
  for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
    for (gtest_ar_4.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._4_4_ = 0;
        gtest_ar_4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ < 3;
        gtest_ar_4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ =
             gtest_ar_4.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ + 1) {
      pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_,(long)local_f0,
                          (long)gtest_ar_4.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
      std::complex<double>::complex(&local_118,(double)j + 0.5,0.0);
      testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
                ((EqHelper *)local_108,"M1(i,j)","T(c + 0.5)",pcVar5,&local_118);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
        pcVar5 = (complex<double> *)0x18;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M2.data_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x18,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&M2.data_,&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M2.data_);
        testing::Message::~Message(&local_120);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      j = j + 1;
    }
  }
  std::complex<double>::complex((complex<double> *)&gtest_ar_5.message_,3.14,0.0);
  value._M_value._8_8_ = pcVar5;
  value._M_value._0_8_ = extraout_RDX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_138,3,value);
  local_160 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                        ((SquareMatrix<std::complex<double>_> *)local_138);
  local_164 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_158,"M2.size()","3",&local_160,&local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_190 = qclab::dense::SquareMatrix<std::complex<double>_>::rows
                        ((SquareMatrix<std::complex<double>_> *)local_138);
  local_194 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_188,"M2.rows()","3",&local_190,&local_194);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1c0 = qclab::dense::SquareMatrix<std::complex<double>_>::cols
                        ((SquareMatrix<std::complex<double>_> *)local_138);
  local_1c4 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1b8,"M2.cols()","3",&local_1c0,&local_1c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_1f4._4_8_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::ld
                 ((SquareMatrix<std::complex<double>_> *)local_138);
  local_1f4._0_4_ = 3;
  pcVar2 = "M2.ld()";
  pcVar5 = (complex<double> *)(local_1f4 + 4);
  pcVar3 = (complex<double> *)local_1f4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1e8,"M2.ld()","3",(long *)pcVar5,(int *)pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar3 = (complex<double> *)
             testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    pcVar5 = (complex<double> *)0x21;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&j_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x21,(char *)pcVar3);
    pcVar2 = (char *)&local_200;
    testing::internal::AssertHelper::operator=((AssertHelper *)&j_2,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j_2);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  for (gtest_ar_9.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar_9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ < 3;
      gtest_ar_9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar_9.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    for (gtest_ar_9.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_4_ = 0;
        (int)gtest_ar_9.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl < 3;
        gtest_ar_9.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (int)gtest_ar_9.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 1) {
      pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                         ((SquareMatrix<std::complex<double>_> *)local_138,
                          (long)gtest_ar_9.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                          (long)(int)gtest_ar_9.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
      std::complex<double>::complex(&local_230,3.14,0.0);
      pcVar2 = "M2(i,j)";
      pcVar3 = &local_230;
      testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
                ((EqHelper *)local_220,"M2(i,j)","T(3.14)",pcVar5,pcVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        pcVar3 = (complex<double> *)
                 testing::AssertionResult::failure_message((AssertionResult *)local_220);
        pcVar5 = (complex<double> *)0x25;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M3.data_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x25,(char *)pcVar3);
        pcVar2 = (char *)&local_238;
        testing::internal::AssertHelper::operator=((AssertHelper *)&M3.data_,(Message *)pcVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3.data_);
        testing::Message::~Message(&local_238);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    }
  }
  std::complex<double>::complex(&local_260,1.0,0.0);
  std::complex<double>::complex(&local_270,2.0,0.0);
  std::complex<double>::complex(&local_280,3.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar_10.message_,4.0,0.0);
  m10._M_value._8_8_ = in_stack_ffffffffffffdbc0;
  m10._M_value._0_8_ = in_stack_ffffffffffffdbb8;
  m11._M_value._8_8_ = in_stack_ffffffffffffdbd0;
  m11._M_value._0_8_ = in_stack_ffffffffffffdbc8;
  m00._M_value._8_8_ = extraout_RDX_00;
  m00._M_value._0_8_ = pcVar2;
  m01._M_value._8_8_ = pcVar3;
  m01._M_value._0_8_ = pcVar5;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_250,m00,m01,m10,m11);
  local_2a8 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                        ((SquareMatrix<std::complex<double>_> *)local_250);
  local_2ac = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2a0,"M3.size()","2",&local_2a8,&local_2ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_2d8 = qclab::dense::SquareMatrix<std::complex<double>_>::rows
                        ((SquareMatrix<std::complex<double>_> *)local_250);
  local_2dc = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2d0,"M3.rows()","2",&local_2d8,&local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_308 = qclab::dense::SquareMatrix<std::complex<double>_>::cols
                        ((SquareMatrix<std::complex<double>_> *)local_250);
  local_30c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_300,"M3.cols()","2",&local_308,&local_30c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_338 = qclab::dense::SquareMatrix<std::complex<double>_>::ld
                        ((SquareMatrix<std::complex<double>_> *)local_250);
  local_33c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_330,"M3.ld()","2",&local_338,&local_33c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_250,0,0);
  std::complex<double>::complex(&local_370,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_360,"M3(0,0)","T(1.0)",pcVar5,&local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_250,1,0);
  std::complex<double>::complex(&local_3a0,3.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_390,"M3(1,0)","T(3.0)",pcVar5,&local_3a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_250,0,1);
  std::complex<double>::complex(&local_3d0,2.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_3c0,"M3(0,1)","T(2.0)",pcVar5,&local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_250,1,1);
  std::complex<double>::complex(&local_400,4.0,0.0);
  pcVar2 = "M3(1,1)";
  pcVar5 = &local_400;
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_3f0,"M3(1,1)","T(4.0)",pcVar3,pcVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar5 = (complex<double> *)
             testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    pcVar3 = (complex<double> *)0x33;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x33,(char *)pcVar5);
    pcVar2 = (char *)&local_408;
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4.data_,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4.data_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  std::complex<double>::complex(&local_430,1.0,0.0);
  std::complex<double>::complex(&local_440,2.0,0.0);
  std::complex<double>::complex(&local_450,3.0,0.0);
  std::complex<double>::complex(&local_460,4.0,0.0);
  std::complex<double>::complex(&local_470,5.0,0.0);
  std::complex<double>::complex(&local_480,6.0,0.0);
  std::complex<double>::complex(&local_490,7.0,0.0);
  std::complex<double>::complex(&local_4a0,8.0,0.0);
  std::complex<double>::complex(&local_4b0,9.0,0.0);
  std::complex<double>::complex(&local_4c0,10.0,0.0);
  std::complex<double>::complex(&local_4d0,11.0,0.0);
  std::complex<double>::complex(&local_4e0,12.0,0.0);
  std::complex<double>::complex(&local_4f0,13.0,0.0);
  std::complex<double>::complex(&local_500,14.0,0.0);
  std::complex<double>::complex(&local_510,15.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar_18.message_,16.0,0.0);
  m02._M_value._8_8_ = local_470._M_value._8_8_;
  m02._M_value._0_8_ = local_470._M_value._0_8_;
  m03._M_value._8_8_ = local_480._M_value._8_8_;
  m03._M_value._0_8_ = local_480._M_value._0_8_;
  m10_15._M_value._8_8_ = local_490._M_value._8_8_;
  m10_15._M_value._0_8_ = local_490._M_value._0_8_;
  m11_15._M_value._8_8_ = local_4a0._M_value._8_8_;
  m11_15._M_value._0_8_ = local_4a0._M_value._0_8_;
  m12._M_value._8_8_ = local_4b0._M_value._8_8_;
  m12._M_value._0_8_ = local_4b0._M_value._0_8_;
  m13._M_value._8_8_ = local_4c0._M_value._8_8_;
  m13._M_value._0_8_ = local_4c0._M_value._0_8_;
  m20._M_value._8_8_ = local_4d0._M_value._8_8_;
  m20._M_value._0_8_ = local_4d0._M_value._0_8_;
  m21._M_value._8_8_ = local_4e0._M_value._8_8_;
  m21._M_value._0_8_ = local_4e0._M_value._0_8_;
  m22._M_value._8_8_ = local_4f0._M_value._8_8_;
  m22._M_value._0_8_ = local_4f0._M_value._0_8_;
  m23._M_value._8_8_ = local_500._M_value._8_8_;
  m23._M_value._0_8_ = local_500._M_value._0_8_;
  m30._M_value._8_8_ = local_510._M_value._8_8_;
  m30._M_value._0_8_ = local_510._M_value._0_8_;
  m31._M_value._8_8_ = uStack_518;
  m31._M_value._0_8_ =
       gtest_ar_18.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32._M_value[10] = in_stack_ffffffffffffdc82;
  m32._M_value._0_10_ = in_stack_ffffffffffffdc78;
  m32._M_value[0xb] = in_stack_ffffffffffffdc83;
  m32._M_value[0xc] = in_stack_ffffffffffffdc84;
  m32._M_value[0xd] = in_stack_ffffffffffffdc85;
  m32._M_value[0xe] = in_stack_ffffffffffffdc86;
  m32._M_value[0xf] = in_stack_ffffffffffffdc87;
  m33._M_value._8_8_ = in_stack_ffffffffffffdc90;
  m33._M_value._0_8_ = in_stack_ffffffffffffdc88;
  m00_00._M_value._8_8_ = extraout_RDX_01;
  m00_00._M_value._0_8_ = pcVar2;
  m01_00._M_value._8_8_ = pcVar5;
  m01_00._M_value._0_8_ = pcVar3;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_420,m00_00,m01_00,m02,m03,m10_15,m11_15,
             m12,m13,m20,m21,m22,m23,m30,m31,m32,m33);
  local_538 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                        ((SquareMatrix<std::complex<double>_> *)local_420);
  local_53c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_530,"M4.size()","4",&local_538,&local_53c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  local_568 = qclab::dense::SquareMatrix<std::complex<double>_>::rows
                        ((SquareMatrix<std::complex<double>_> *)local_420);
  local_56c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_560,"M4.rows()","4",&local_568,&local_56c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  local_598 = qclab::dense::SquareMatrix<std::complex<double>_>::cols
                        ((SquareMatrix<std::complex<double>_> *)local_420);
  local_59c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_590,"M4.cols()","4",&local_598,&local_59c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  local_5c8 = qclab::dense::SquareMatrix<std::complex<double>_>::ld
                        ((SquareMatrix<std::complex<double>_> *)local_420);
  local_5cc = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_5c0,"M4.ld()","4",&local_5c8,&local_5cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_5d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,0,0);
  std::complex<double>::complex(&local_600,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_5f0,"M4(0,0)","T( 1.0)",pcVar5,&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,1,0);
  std::complex<double>::complex(&local_630,5.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_620,"M4(1,0)","T( 5.0)",pcVar5,&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,2,0);
  std::complex<double>::complex(&local_660,9.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_650,"M4(2,0)","T( 9.0)",pcVar5,&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar1) {
    testing::Message::Message(&local_668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,3,0);
  std::complex<double>::complex(&local_690,13.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_680,"M4(3,0)","T(13.0)",pcVar5,&local_690);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,0,1);
  std::complex<double>::complex(&local_6c0,2.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_6b0,"M4(0,1)","T( 2.0)",pcVar5,&local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,1,1);
  std::complex<double>::complex(&local_6f0,6.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_6e0,"M4(1,1)","T( 6.0)",pcVar5,&local_6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,2,1);
  std::complex<double>::complex(&local_720,10.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_710,"M4(2,1)","T(10.0)",pcVar5,&local_720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,3,1);
  std::complex<double>::complex(&local_750,14.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_740,"M4(3,1)","T(14.0)",pcVar5,&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,0,2);
  std::complex<double>::complex(&local_780,3.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_770,"M4(0,2)","T( 3.0)",pcVar5,&local_780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,1,2);
  std::complex<double>::complex(&local_7b0,7.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_7a0,"M4(1,2)","T( 7.0)",pcVar5,&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,2,2);
  std::complex<double>::complex(&local_7e0,11.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_7d0,"M4(2,2)","T(11.0)",pcVar5,&local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,3,2);
  std::complex<double>::complex(&local_810,15.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_800,"M4(3,2)","T(15.0)",pcVar5,&local_810);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_818);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,0,3);
  std::complex<double>::complex(&local_840,4.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_830,"M4(0,3)","T( 4.0)",pcVar5,&local_840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(&local_848);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,1,3);
  std::complex<double>::complex(&local_870,8.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_860,"M4(1,3)","T( 8.0)",pcVar5,&local_870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,2,3);
  std::complex<double>::complex(&local_8a0,12.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_890,"M4(2,3)","T(12.0)",pcVar5,&local_8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_420,3,3);
  std::complex<double>::complex(&local_8d0,16.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_8c0,"M4(3,3)","T(16.0)",pcVar5,&local_8d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy.data_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy.data_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_38.message_,
             (SquareMatrix<std::complex<double>_> *)local_420);
  local_908 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_38.message_);
  local_90c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_900,"M4copy.size()","4",&local_908,&local_90c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_918);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  local_938 = qclab::dense::SquareMatrix<std::complex<double>_>::rows
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_38.message_);
  local_93c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_930,"M4copy.rows()","4",&local_938,&local_93c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_948);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  local_968 = qclab::dense::SquareMatrix<std::complex<double>_>::cols
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_38.message_);
  local_96c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_960,"M4copy.cols()","4",&local_968,&local_96c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_960);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  local_998 = qclab::dense::SquareMatrix<std::complex<double>_>::ld
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_38.message_);
  local_99c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_990,"M4copy.ld()","4",&local_998,&local_99c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_9c1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_38.message_,
                         (SquareMatrix<std::complex<double>_> *)local_420);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9c0,&local_9c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M1copy.data_,(internal *)local_9c0,(AssertionResult *)"M4copy == M4",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9d8,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    std::__cxx11::string::~string((string *)&M1copy.data_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  local_a20 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_);
  local_a24 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_a18,"M1copy.size()","3",&local_a20,&local_a24);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar1) {
    testing::Message::Message(&local_a30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_a30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  local_a50 = qclab::dense::SquareMatrix<std::complex<double>_>::rows
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_);
  local_a54 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_a48,"M1copy.rows()","3",&local_a50,&local_a54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
  if (!bVar1) {
    testing::Message::Message(&local_a60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_a60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
  local_a80 = qclab::dense::SquareMatrix<std::complex<double>_>::cols
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_);
  local_a84 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_a78,"M1copy.cols()","3",&local_a80,&local_a84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a78);
  if (!bVar1) {
    testing::Message::Message(&local_a90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_a90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a78);
  local_ab0 = qclab::dense::SquareMatrix<std::complex<double>_>::ld
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_);
  local_ab4 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_aa8,"M1copy.ld()","3",&local_ab0,&local_ab4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa8);
  if (!bVar1) {
    testing::Message::Message(&local_ac0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_aa8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_ac0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_ac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa8);
  local_ad9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_,
                         (SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ad8,&local_ad9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar1) {
    testing::Message::Message(&local_ae8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M2copy.data_,(internal *)local_ad8,(AssertionResult *)"M1copy == M1",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_af0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_af0,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper(&local_af0);
    std::__cxx11::string::~string((string *)&M2copy.data_);
    testing::Message::~Message(&local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_,3);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_,
             (SquareMatrix<std::complex<double>_> *)local_138);
  local_b38 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_);
  local_b3c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_b30,"M2copy.size()","3",&local_b38,&local_b3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar1) {
    testing::Message::Message(&local_b48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_b48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  local_b68 = qclab::dense::SquareMatrix<std::complex<double>_>::rows
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_);
  local_b6c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_b60,"M2copy.rows()","3",&local_b68,&local_b6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b60);
  if (!bVar1) {
    testing::Message::Message(&local_b78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_b78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b60);
  local_b98 = qclab::dense::SquareMatrix<std::complex<double>_>::cols
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_);
  local_b9c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_b90,"M2copy.cols()","3",&local_b98,&local_b9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  local_bc8 = qclab::dense::SquareMatrix<std::complex<double>_>::ld
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_);
  local_bcc = 3;
  plVar6 = &local_bc8;
  piVar4 = &local_bcc;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_bc0,"M2copy.ld()","3",plVar6,piVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bd8);
    piVar4 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    plVar6 = (long *)0x68;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x68,(char *)piVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_bd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  local_bf1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_,
                         (SquareMatrix<std::complex<double>_> *)local_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bf0,&local_bf1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
  if (!bVar1) {
    testing::Message::Message(&local_c00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_bf0,
               (AssertionResult *)"M2copy == M2","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x69;
    testing::internal::AssertHelper::AssertHelper
              (&local_c08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x69,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_c08,&local_c00);
    testing::internal::AssertHelper::~AssertHelper(&local_c08);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
  local_c39 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)local_138,
                         (SquareMatrix<std::complex<double>_> *)local_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c38,&local_c39,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c38);
  if (!bVar1) {
    testing::Message::Message(&local_c48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_c38,(AssertionResult *)"M2 == M2",
               "false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6c;
    testing::internal::AssertHelper::AssertHelper
              (&local_c50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_c50,&local_c48);
    testing::internal::AssertHelper::~AssertHelper(&local_c50);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_c48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c38);
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator!=
                    ((SquareMatrix<std::complex<double>_> *)local_138,
                     (SquareMatrix<std::complex<double>_> *)local_138);
  local_c81 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c80,&local_c81,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(&local_c90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_c80,(AssertionResult *)"M2 != M2",
               "true","false",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6c;
    testing::internal::AssertHelper::AssertHelper
              (&local_c98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
    testing::internal::AssertHelper::~AssertHelper(&local_c98);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  local_cc9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)local_250,
                         (SquareMatrix<std::complex<double>_> *)local_250);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cc8,&local_cc9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc8);
  if (!bVar1) {
    testing::Message::Message(&local_cd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_cc8,(AssertionResult *)"M3 == M3",
               "false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6d;
    testing::internal::AssertHelper::AssertHelper
              (&local_ce0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_ce0,&local_cd8);
    testing::internal::AssertHelper::~AssertHelper(&local_ce0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_cd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc8);
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator!=
                    ((SquareMatrix<std::complex<double>_> *)local_250,
                     (SquareMatrix<std::complex<double>_> *)local_250);
  local_d11 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d10,&local_d11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d10);
  if (!bVar1) {
    testing::Message::Message(&local_d20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_d10,(AssertionResult *)"M3 != M3",
               "true","false",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6d;
    testing::internal::AssertHelper::AssertHelper
              (&local_d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_d28,&local_d20);
    testing::internal::AssertHelper::~AssertHelper(&local_d28);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d10);
  local_d59 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)local_420,
                         (SquareMatrix<std::complex<double>_> *)local_420);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d58,&local_d59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d58);
  if (!bVar1) {
    testing::Message::Message(&local_d68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_d58,(AssertionResult *)"M4 == M4",
               "false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6e;
    testing::internal::AssertHelper::AssertHelper
              (&local_d70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_d70,&local_d68);
    testing::internal::AssertHelper::~AssertHelper(&local_d70);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d58);
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator!=
                    ((SquareMatrix<std::complex<double>_> *)local_420,
                     (SquareMatrix<std::complex<double>_> *)local_420);
  local_da1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_da0,&local_da1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar1) {
    testing::Message::Message(&local_db0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_da0,(AssertionResult *)"M4 != M4",
               "true","false",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6e;
    testing::internal::AssertHelper::AssertHelper
              (&local_db8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_db8,&local_db0);
    testing::internal::AssertHelper::~AssertHelper(&local_db8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  local_de9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator!=
                        ((SquareMatrix<std::complex<double>_> *)local_138,
                         (SquareMatrix<std::complex<double>_> *)local_250);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_de8,&local_de9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_de8);
  if (!bVar1) {
    testing::Message::Message(&local_df8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_de8,(AssertionResult *)"M2 != M3",
               "false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6f;
    testing::internal::AssertHelper::AssertHelper
              (&local_e00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_e00,&local_df8);
    testing::internal::AssertHelper::~AssertHelper(&local_e00);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_df8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_de8);
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)local_138,
                     (SquareMatrix<std::complex<double>_> *)local_250);
  local_e31 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e30,&local_e31,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e30);
  if (!bVar1) {
    testing::Message::Message(&local_e40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_e30,(AssertionResult *)"M2 == M3",
               "true","false",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x6f;
    testing::internal::AssertHelper::AssertHelper
              (&local_e48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_e48,&local_e40);
    testing::internal::AssertHelper::~AssertHelper(&local_e48);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e30);
  local_e79 = qclab::dense::SquareMatrix<std::complex<double>_>::operator!=
                        ((SquareMatrix<std::complex<double>_> *)local_250,
                         (SquareMatrix<std::complex<double>_> *)local_420);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e78,&local_e79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e78);
  if (!bVar1) {
    testing::Message::Message(&local_e88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_e78,(AssertionResult *)"M3 != M4",
               "false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x70;
    testing::internal::AssertHelper::AssertHelper
              (&local_e90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_e90,&local_e88);
    testing::internal::AssertHelper::~AssertHelper(&local_e90);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_e88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e78);
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)local_250,
                     (SquareMatrix<std::complex<double>_> *)local_420);
  local_ec1[0] = ~bVar1 & 1;
  pMVar7 = (Message *)local_ec1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_ec1 + 1),(bool *)pMVar7,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_ec1 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_ed0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M5.data_,(internal *)(local_ec1 + 1),(AssertionResult *)"M3 == M4","true",
               "false",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x70;
    testing::internal::AssertHelper::AssertHelper
              (&local_ed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,(char *)piVar4);
    pMVar7 = &local_ed0;
    testing::internal::AssertHelper::operator=(&local_ed8,pMVar7);
    testing::internal::AssertHelper::~AssertHelper(&local_ed8);
    std::__cxx11::string::~string((string *)&M5.data_);
    testing::Message::~Message(&local_ed0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_ec1 + 1));
  std::complex<double>::complex(&local_f18,1.0,0.0);
  std::complex<double>::complex(&local_f28,2.0,0.0);
  std::complex<double>::complex(&local_f38,3.0,0.0);
  std::complex<double>::complex(&local_f48,4.0,0.0);
  std::complex<double>::complex(&local_f58,5.0,0.0);
  std::complex<double>::complex(&local_f68,6.0,0.0);
  std::complex<double>::complex(&local_f78,0.0,0.0);
  std::complex<double>::complex(&local_f88,8.0,0.0);
  std::complex<double>::complex(&local_f98,9.0,0.0);
  std::complex<double>::complex(&local_fa8,10.0,0.0);
  std::complex<double>::complex(&local_fb8,11.0,0.0);
  std::complex<double>::complex(&local_fc8,12.0,0.0);
  std::complex<double>::complex(&local_fd8,13.0,0.0);
  std::complex<double>::complex(&local_fe8,14.0,0.0);
  std::complex<double>::complex(&local_ff8,15.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__13.message_,16.0,0.0);
  m02_00._M_value._8_8_ = local_f58._M_value._8_8_;
  m02_00._M_value._0_8_ = local_f58._M_value._0_8_;
  m03_00._M_value._8_8_ = local_f68._M_value._8_8_;
  m03_00._M_value._0_8_ = local_f68._M_value._0_8_;
  m10_16._M_value._8_8_ = local_f78._M_value._8_8_;
  m10_16._M_value._0_8_ = local_f78._M_value._0_8_;
  m11_16._M_value._8_8_ = local_f88._M_value._8_8_;
  m11_16._M_value._0_8_ = local_f88._M_value._0_8_;
  m12_00._M_value._8_8_ = local_f98._M_value._8_8_;
  m12_00._M_value._0_8_ = local_f98._M_value._0_8_;
  m13_00._M_value._8_8_ = local_fa8._M_value._8_8_;
  m13_00._M_value._0_8_ = local_fa8._M_value._0_8_;
  m20_00._M_value._8_8_ = local_fb8._M_value._8_8_;
  m20_00._M_value._0_8_ = local_fb8._M_value._0_8_;
  m21_00._M_value._8_8_ = local_fc8._M_value._8_8_;
  m21_00._M_value._0_8_ = local_fc8._M_value._0_8_;
  m22_00._M_value._8_8_ = local_fd8._M_value._8_8_;
  m22_00._M_value._0_8_ = local_fd8._M_value._0_8_;
  m23_00._M_value._8_8_ = local_fe8._M_value._8_8_;
  m23_00._M_value._0_8_ = local_fe8._M_value._0_8_;
  m30_00._M_value._8_8_ = local_ff8._M_value._8_8_;
  m30_00._M_value._0_8_ = local_ff8._M_value._0_8_;
  m31_00._M_value._8_8_ = uStack_1000;
  m31_00._M_value._0_8_ =
       gtest_ar__13.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32_00._M_value[10] = in_stack_ffffffffffffdc82;
  m32_00._M_value._0_10_ = in_stack_ffffffffffffdc78;
  m32_00._M_value[0xb] = in_stack_ffffffffffffdc83;
  m32_00._M_value[0xc] = in_stack_ffffffffffffdc84;
  m32_00._M_value[0xd] = in_stack_ffffffffffffdc85;
  m32_00._M_value[0xe] = in_stack_ffffffffffffdc86;
  m32_00._M_value[0xf] = in_stack_ffffffffffffdc87;
  m33_00._M_value._8_8_ = in_stack_ffffffffffffdc90;
  m33_00._M_value._0_8_ = in_stack_ffffffffffffdc88;
  m00_01._M_value._8_8_ = extraout_RDX_02;
  m00_01._M_value._0_8_ = pMVar7;
  m01_01._M_value._8_8_ = piVar4;
  m01_01._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_f08,m00_01,m01_01,m02_00,m03_00,m10_16,
             m11_16,m12_00,m13_00,m20_00,m21_00,m22_00,m23_00,m30_00,m31_00,m32_00,m33_00);
  local_1019 = qclab::dense::SquareMatrix<std::complex<double>_>::operator!=
                         ((SquareMatrix<std::complex<double>_> *)local_420,
                          (SquareMatrix<std::complex<double>_> *)local_f08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1018,&local_1019,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1018);
  uVar9 = local_f58._M_value._0_8_;
  uVar10 = local_f58._M_value._8_8_;
  uVar11 = local_f68._M_value._0_8_;
  uVar12 = local_f68._M_value._8_8_;
  if (!bVar1) {
    testing::Message::Message(&local_1028);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_1018,(AssertionResult *)"M4 != M5"
               ,"false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x76;
    testing::internal::AssertHelper::AssertHelper
              (&local_1030,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1030,&local_1028);
    testing::internal::AssertHelper::~AssertHelper(&local_1030);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_1028);
    uVar9 = local_f58._M_value._0_8_;
    uVar10 = local_f58._M_value._8_8_;
    uVar11 = local_f68._M_value._0_8_;
    uVar12 = local_f68._M_value._8_8_;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1018);
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)local_420,
                     (SquareMatrix<std::complex<double>_> *)local_f08);
  local_1061 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1060,&local_1061,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1060);
  if (!bVar1) {
    testing::Message::Message(&local_1070);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_1060,(AssertionResult *)"M4 == M5"
               ,"true","false",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x76;
    testing::internal::AssertHelper::AssertHelper
              (&local_1078,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1078,&local_1070);
    testing::internal::AssertHelper::~AssertHelper(&local_1078);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_1070);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1060);
  pcVar5 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                     ((SquareMatrix<std::complex<double>_> *)local_f08,1,2);
  std::complex<double>::operator=(pcVar5,7.0);
  local_10a9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_420,
                          (SquareMatrix<std::complex<double>_> *)local_f08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10a8,&local_10a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10a8);
  if (!bVar1) {
    testing::Message::Message(&local_10b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_10a8,(AssertionResult *)"M4 == M5"
               ,"false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x78;
    testing::internal::AssertHelper::AssertHelper
              (&local_10c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_10c0,&local_10b8);
    testing::internal::AssertHelper::~AssertHelper(&local_10c0);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_10b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10a8);
  bVar1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator!=
                    ((SquareMatrix<std::complex<double>_> *)local_420,
                     (SquareMatrix<std::complex<double>_> *)local_f08);
  local_10f1[0] = ~bVar1 & 1;
  pMVar7 = (Message *)local_10f1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_10f1 + 1),(bool *)pMVar7,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_10f1 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_1100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A.data_,(internal *)(local_10f1 + 1),(AssertionResult *)"M4 != M5","true",
               "false",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x78;
    testing::internal::AssertHelper::AssertHelper
              (&local_1108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,(char *)piVar4);
    pMVar7 = &local_1100;
    testing::internal::AssertHelper::operator=(&local_1108,pMVar7);
    testing::internal::AssertHelper::~AssertHelper(&local_1108);
    std::__cxx11::string::~string((string *)&A.data_);
    testing::Message::~Message(&local_1100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_10f1 + 1));
  std::complex<double>::complex(&local_1148,1.0,0.0);
  std::complex<double>::complex(&local_1158,2.0,0.0);
  std::complex<double>::complex(&local_1168,3.0,0.0);
  std::complex<double>::complex((complex<double> *)&B.data_,4.0,0.0);
  m10_00._M_value._8_8_ = uVar10;
  m10_00._M_value._0_8_ = uVar9;
  m11_00._M_value._8_8_ = uVar12;
  m11_00._M_value._0_8_ = uVar11;
  m00_02._M_value._8_8_ = extraout_RDX_03;
  m00_02._M_value._0_8_ = pMVar7;
  m01_02._M_value._8_8_ = piVar4;
  m01_02._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1138,m00_02,m01_02,m10_00,m11_00);
  std::complex<double>::complex(&local_1198,5.0,0.0);
  std::complex<double>::complex(&local_11a8,7.0,0.0);
  std::complex<double>::complex(&local_11b8,6.0,0.0);
  std::complex<double>::complex((complex<double> *)&C.data_,8.0,0.0);
  m10_01._M_value._8_8_ = uVar10;
  m10_01._M_value._0_8_ = uVar9;
  m11_01._M_value._8_8_ = uVar12;
  m11_01._M_value._0_8_ = uVar11;
  m00_03._M_value._8_8_ = extraout_RDX_04;
  m00_03._M_value._0_8_ = pMVar7;
  m01_03._M_value._8_8_ = piVar4;
  m01_03._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1188,m00_03,m01_03,m10_01,m11_01);
  std::complex<double>::complex(&local_11e8,9.0,0.0);
  std::complex<double>::complex(&local_11f8,11.0,0.0);
  std::complex<double>::complex(&local_1208,10.0,0.0);
  std::complex<double>::complex((complex<double> *)&D.data_,12.0,0.0);
  m10_02._M_value._8_8_ = uVar10;
  m10_02._M_value._0_8_ = uVar9;
  m11_02._M_value._8_8_ = uVar12;
  m11_02._M_value._0_8_ = uVar11;
  m00_04._M_value._8_8_ = extraout_RDX_05;
  m00_04._M_value._0_8_ = pMVar7;
  m01_04._M_value._8_8_ = piVar4;
  m01_04._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_11d8,m00_04,m01_04,m10_02,m11_02);
  std::complex<double>::complex(&local_1238,13.0,0.0);
  std::complex<double>::complex(&local_1248,14.0,0.0);
  std::complex<double>::complex(&local_1258,15.0,0.0);
  std::complex<double>::complex((complex<double> *)&sumAB_check.data_,16.0,0.0);
  m10_03._M_value._8_8_ = uVar10;
  m10_03._M_value._0_8_ = uVar9;
  m11_03._M_value._8_8_ = uVar12;
  m11_03._M_value._0_8_ = uVar11;
  m00_05._M_value._8_8_ = extraout_RDX_06;
  m00_05._M_value._0_8_ = pMVar7;
  m01_05._M_value._8_8_ = piVar4;
  m01_05._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1228,m00_05,m01_05,m10_03,m11_03);
  std::complex<double>::complex(&local_1288,6.0,0.0);
  std::complex<double>::complex(&local_1298,9.0,0.0);
  std::complex<double>::complex(&local_12a8,9.0,0.0);
  std::complex<double>::complex((complex<double> *)&sumABC_check.data_,12.0,0.0);
  m10_04._M_value._8_8_ = uVar10;
  m10_04._M_value._0_8_ = uVar9;
  m11_04._M_value._8_8_ = uVar12;
  m11_04._M_value._0_8_ = uVar11;
  m00_06._M_value._8_8_ = extraout_RDX_07;
  m00_06._M_value._0_8_ = pMVar7;
  m01_06._M_value._8_8_ = piVar4;
  m01_06._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1278,m00_06,m01_06,m10_04,m11_04);
  std::complex<double>::complex(&local_12d8,15.0,0.0);
  std::complex<double>::complex(&local_12e8,20.0,0.0);
  std::complex<double>::complex(&local_12f8,19.0,0.0);
  std::complex<double>::complex((complex<double> *)&sumABCD_check.data_,24.0,0.0);
  m10_05._M_value._8_8_ = uVar10;
  m10_05._M_value._0_8_ = uVar9;
  m11_05._M_value._8_8_ = uVar12;
  m11_05._M_value._0_8_ = uVar11;
  m00_07._M_value._8_8_ = extraout_RDX_08;
  m00_07._M_value._0_8_ = pMVar7;
  m01_07._M_value._8_8_ = piVar4;
  m01_07._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_12c8,m00_07,m01_07,m10_05,m11_05);
  std::complex<double>::complex(&local_1328,28.0,0.0);
  std::complex<double>::complex(&local_1338,34.0,0.0);
  std::complex<double>::complex(&local_1348,34.0,0.0);
  std::complex<double>::complex((complex<double> *)&sumAB.data_,40.0,0.0);
  m10_06._M_value._8_8_ = uVar10;
  m10_06._M_value._0_8_ = uVar9;
  m11_06._M_value._8_8_ = uVar12;
  m11_06._M_value._0_8_ = uVar11;
  m00_08._M_value._8_8_ = extraout_RDX_09;
  m00_08._M_value._0_8_ = pMVar7;
  m01_08._M_value._8_8_ = piVar4;
  m01_08._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1318,m00_08,m01_08,m10_06,m11_06);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_50.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator+
            ((dense *)local_1368,(SquareMatrix<std::complex<double>_> *)&gtest_ar_50.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_50.message_);
  local_1390 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_1368);
  local_1394 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1388,"sumAB.size()","2",&local_1390,&local_1394);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1388);
  if (!bVar1) {
    testing::Message::Message(&local_13a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_13a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_13a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1388);
  local_13b9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_1368,
                          (SquareMatrix<std::complex<double>_> *)local_1278);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_13b8,&local_13b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13b8);
  if (!bVar1) {
    testing::Message::Message(&local_13c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sumABC.data_,(internal *)local_13b8,
               (AssertionResult *)"sumAB == sumAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_13d0,&local_13c8);
    testing::internal::AssertHelper::~AssertHelper(&local_13d0);
    std::__cxx11::string::~string((string *)&sumABC.data_);
    testing::Message::~Message(&local_13c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_51.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator+
            ((dense *)&local_1410,(SquareMatrix<std::complex<double>_> *)&gtest_ar_51.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::operator+
            ((dense *)local_1400,&local_1410,(SquareMatrix<std::complex<double>_> *)local_11d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1410);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_51.message_);
  local_1438 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_1400);
  local_143c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1430,"sumABC.size()","2",&local_1438,&local_143c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1430);
  if (!bVar1) {
    testing::Message::Message(&local_1448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__18.message_,&local_1448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_1448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1430);
  local_1461 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_1400,
                          (SquareMatrix<std::complex<double>_> *)local_12c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1460,&local_1461,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1460);
  if (!bVar1) {
    testing::Message::Message(&local_1470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sumABCD.data_,(internal *)local_1460,
               (AssertionResult *)"sumABC == sumABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1478,&local_1470);
    testing::internal::AssertHelper::~AssertHelper(&local_1478);
    std::__cxx11::string::~string((string *)&sumABCD.data_);
    testing::Message::~Message(&local_1470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1460);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_52.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator+
            ((dense *)&local_14c8,(SquareMatrix<std::complex<double>_> *)&gtest_ar_52.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::operator+
            ((dense *)&local_14b8,&local_14c8,(SquareMatrix<std::complex<double>_> *)local_11d8);
  qclab::dense::operator+
            ((dense *)local_14a8,&local_14b8,(SquareMatrix<std::complex<double>_> *)local_1228);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_14b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_14c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_52.message_);
  local_14f0 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_14a8);
  local_14f4 = 2;
  plVar6 = &local_14f0;
  piVar4 = &local_14f4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_14e8,"sumABCD.size()","2",plVar6,piVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
  if (!bVar1) {
    testing::Message::Message(&local_1500);
    piVar4 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_14e8);
    plVar6 = (long *)0x94;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x94,(char *)piVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__19.message_,&local_1500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
  local_1519 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_14a8,
                          (SquareMatrix<std::complex<double>_> *)local_1318);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1518,&local_1519,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1518);
  if (!bVar1) {
    testing::Message::Message(&local_1528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sum.data_,(internal *)local_1518,
               (AssertionResult *)"sumABCD == sumABCD_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x95;
    testing::internal::AssertHelper::AssertHelper
              (&local_1530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x95,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1530,&local_1528);
    testing::internal::AssertHelper::~AssertHelper(&local_1530);
    std::__cxx11::string::~string((string *)&sum.data_);
    testing::Message::~Message(&local_1528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1518);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator+=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  local_1571 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_,
                          (SquareMatrix<std::complex<double>_> *)local_1278);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1570,&local_1571,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1570);
  if (!bVar1) {
    testing::Message::Message(&local_1580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_1570,
               (AssertionResult *)"sum == sumAB_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x98;
    testing::internal::AssertHelper::AssertHelper
              (&local_1588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x98,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1588,&local_1580);
    testing::internal::AssertHelper::~AssertHelper(&local_1588);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_1580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1570);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator+=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<double>_> *)local_11d8);
  local_15b9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_,
                          (SquareMatrix<std::complex<double>_> *)local_12c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_15b8,&local_15b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15b8);
  if (!bVar1) {
    testing::Message::Message(&local_15c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_15b8,
               (AssertionResult *)"sum == sumABC_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x99;
    testing::internal::AssertHelper::AssertHelper
              (&local_15d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x99,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_15d0,&local_15c8);
    testing::internal::AssertHelper::~AssertHelper(&local_15d0);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_15c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator+=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<double>_> *)local_1228);
  local_1601[0] =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_,
                  (SquareMatrix<std::complex<double>_> *)local_1318);
  pMVar7 = (Message *)local_1601;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_1601 + 1),(bool *)pMVar7,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1601 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_1610);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusAB_check.data_,(internal *)(local_1601 + 1),
               (AssertionResult *)"sum == sumABCD_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0x9a;
    testing::internal::AssertHelper::AssertHelper
              (&local_1618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x9a,(char *)piVar4);
    pMVar7 = &local_1610;
    testing::internal::AssertHelper::operator=(&local_1618,pMVar7);
    testing::internal::AssertHelper::~AssertHelper(&local_1618);
    std::__cxx11::string::~string((string *)&minusAB_check.data_);
    testing::Message::~Message(&local_1610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1601 + 1));
  std::complex<double>::complex(&local_1658,-4.0,0.0);
  std::complex<double>::complex(&local_1668,-5.0,0.0);
  std::complex<double>::complex(&local_1678,-3.0,0.0);
  std::complex<double>::complex((complex<double> *)&minusABC_check.data_,-4.0,0.0);
  m10_07._M_value._8_8_ = uVar10;
  m10_07._M_value._0_8_ = uVar9;
  m11_07._M_value._8_8_ = uVar12;
  m11_07._M_value._0_8_ = uVar11;
  m00_09._M_value._8_8_ = extraout_RDX_10;
  m00_09._M_value._0_8_ = pMVar7;
  m01_09._M_value._8_8_ = piVar4;
  m01_09._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1648,m00_09,m01_09,m10_07,m11_07);
  std::complex<double>::complex(&local_16a8,-13.0,0.0);
  std::complex<double>::complex(&local_16b8,-16.0,0.0);
  std::complex<double>::complex(&local_16c8,-13.0,0.0);
  std::complex<double>::complex((complex<double> *)&minusABCD_check.data_,-16.0,0.0);
  m10_08._M_value._8_8_ = uVar10;
  m10_08._M_value._0_8_ = uVar9;
  m11_08._M_value._8_8_ = uVar12;
  m11_08._M_value._0_8_ = uVar11;
  m00_10._M_value._8_8_ = extraout_RDX_11;
  m00_10._M_value._0_8_ = pMVar7;
  m01_10._M_value._8_8_ = piVar4;
  m01_10._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1698,m00_10,m01_10,m10_08,m11_08);
  std::complex<double>::complex(&local_16f8,-26.0,0.0);
  std::complex<double>::complex(&local_1708,-30.0,0.0);
  std::complex<double>::complex(&local_1718,-28.0,0.0);
  std::complex<double>::complex((complex<double> *)&minusAB.data_,-32.0,0.0);
  m10_09._M_value._8_8_ = uVar10;
  m10_09._M_value._0_8_ = uVar9;
  m11_09._M_value._8_8_ = uVar12;
  m11_09._M_value._0_8_ = uVar11;
  m00_11._M_value._8_8_ = extraout_RDX_12;
  m00_11._M_value._0_8_ = pMVar7;
  m01_11._M_value._8_8_ = piVar4;
  m01_11._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_16e8,m00_11,m01_11,m10_09,m11_09);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_53.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator-
            ((dense *)local_1738,(SquareMatrix<std::complex<double>_> *)&gtest_ar_53.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_53.message_);
  local_1760 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_1738);
  local_1764 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1758,"minusAB.size()","2",&local_1760,&local_1764);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1758);
  if (!bVar1) {
    testing::Message::Message(&local_1770);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__23.message_,&local_1770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_1770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1758);
  local_1789 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_1738,
                          (SquareMatrix<std::complex<double>_> *)local_1648);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1788,&local_1789,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1788);
  if (!bVar1) {
    testing::Message::Message(&local_1798);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusABC.data_,(internal *)local_1788,
               (AssertionResult *)"minusAB == minusAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17a0,&local_1798);
    testing::internal::AssertHelper::~AssertHelper(&local_17a0);
    std::__cxx11::string::~string((string *)&minusABC.data_);
    testing::Message::~Message(&local_1798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1788);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_54.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator-
            ((dense *)&local_17e0,(SquareMatrix<std::complex<double>_> *)&gtest_ar_54.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::operator-
            ((dense *)local_17d0,&local_17e0,(SquareMatrix<std::complex<double>_> *)local_11d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_17e0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_54.message_);
  local_1808 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_17d0);
  local_180c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1800,"minusABC.size()","2",&local_1808,&local_180c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1800);
  if (!bVar1) {
    testing::Message::Message(&local_1818);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__24.message_,&local_1818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_1818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1800);
  local_1831 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_17d0,
                          (SquareMatrix<std::complex<double>_> *)local_1698);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1830,&local_1831,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1830);
  if (!bVar1) {
    testing::Message::Message(&local_1840);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusABCD.data_,(internal *)local_1830,
               (AssertionResult *)"minusABC == minusABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1848,&local_1840);
    testing::internal::AssertHelper::~AssertHelper(&local_1848);
    std::__cxx11::string::~string((string *)&minusABCD.data_);
    testing::Message::~Message(&local_1840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1830);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_55.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator-
            ((dense *)&local_1898,(SquareMatrix<std::complex<double>_> *)&gtest_ar_55.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::operator-
            ((dense *)&local_1888,&local_1898,(SquareMatrix<std::complex<double>_> *)local_11d8);
  qclab::dense::operator-
            ((dense *)local_1878,&local_1888,(SquareMatrix<std::complex<double>_> *)local_1228);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1888);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1898);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_55.message_);
  local_18c0 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_1878);
  local_18c4 = 2;
  plVar6 = &local_18c0;
  piVar4 = &local_18c4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_18b8,"minusABCD.size()","2",plVar6,piVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18b8);
  if (!bVar1) {
    testing::Message::Message(&local_18d0);
    piVar4 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_18b8);
    plVar6 = (long *)0xac;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xac,(char *)piVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__25.message_,&local_18d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_18d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18b8);
  local_18e9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_1878,
                          (SquareMatrix<std::complex<double>_> *)local_16e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_18e8,&local_18e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18e8);
  if (!bVar1) {
    testing::Message::Message(&local_18f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minus.data_,(internal *)local_18e8,
               (AssertionResult *)"minusABCD == minusABCD_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xad;
    testing::internal::AssertHelper::AssertHelper
              (&local_1900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xad,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1900,&local_18f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1900);
    std::__cxx11::string::~string((string *)&minus.data_);
    testing::Message::~Message(&local_18f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18e8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator-=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  local_1941 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
                          (SquareMatrix<std::complex<double>_> *)local_1648);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1940,&local_1941,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1940);
  if (!bVar1) {
    testing::Message::Message(&local_1950);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_1940,
               (AssertionResult *)"minus == minusAB_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xb0;
    testing::internal::AssertHelper::AssertHelper
              (&local_1958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb0,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1958,&local_1950);
    testing::internal::AssertHelper::~AssertHelper(&local_1958);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_1950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1940);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator-=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<double>_> *)local_11d8);
  local_1989 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
                          (SquareMatrix<std::complex<double>_> *)local_1698);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1988,&local_1989,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1988);
  if (!bVar1) {
    testing::Message::Message(&local_1998);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_1988,
               (AssertionResult *)"minus == minusABC_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xb1;
    testing::internal::AssertHelper::AssertHelper
              (&local_19a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb1,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_19a0,&local_1998);
    testing::internal::AssertHelper::~AssertHelper(&local_19a0);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_1998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1988);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator-=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<double>_> *)local_1228);
  local_19d1[0] =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_,
                  (SquareMatrix<std::complex<double>_> *)local_16e8);
  pMVar7 = (Message *)local_19d1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_19d1 + 1),(bool *)pMVar7,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_19d1 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_19e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodAB_check.data_,(internal *)(local_19d1 + 1),
               (AssertionResult *)"minus == minusABCD_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xb2;
    testing::internal::AssertHelper::AssertHelper
              (&local_19e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb2,(char *)piVar4);
    pMVar7 = &local_19e0;
    testing::internal::AssertHelper::operator=(&local_19e8,pMVar7);
    testing::internal::AssertHelper::~AssertHelper(&local_19e8);
    std::__cxx11::string::~string((string *)&prodAB_check.data_);
    testing::Message::~Message(&local_19e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_19d1 + 1));
  std::complex<double>::complex(&local_1a28,17.0,0.0);
  std::complex<double>::complex(&local_1a38,23.0,0.0);
  std::complex<double>::complex(&local_1a48,39.0,0.0);
  std::complex<double>::complex((complex<double> *)&prodABC_check.data_,53.0,0.0);
  m10_10._M_value._8_8_ = uVar10;
  m10_10._M_value._0_8_ = uVar9;
  m11_10._M_value._8_8_ = uVar12;
  m11_10._M_value._0_8_ = uVar11;
  m00_12._M_value._8_8_ = extraout_RDX_13;
  m00_12._M_value._0_8_ = pMVar7;
  m01_12._M_value._8_8_ = piVar4;
  m01_12._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1a18,m00_12,m01_12,m10_10,m11_10);
  std::complex<double>::complex(&local_1a78,383.0,0.0);
  std::complex<double>::complex(&local_1a88,463.0,0.0);
  std::complex<double>::complex(&local_1a98,881.0,0.0);
  std::complex<double>::complex((complex<double> *)&prodABCD_check.data_,1065.0,0.0);
  m10_11._M_value._8_8_ = uVar10;
  m10_11._M_value._0_8_ = uVar9;
  m11_11._M_value._8_8_ = uVar12;
  m11_11._M_value._0_8_ = uVar11;
  m00_13._M_value._8_8_ = extraout_RDX_14;
  m00_13._M_value._0_8_ = pMVar7;
  m01_13._M_value._8_8_ = piVar4;
  m01_13._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1a68,m00_13,m01_13,m10_11,m11_11);
  std::complex<double>::complex(&local_1ac8,11924.0,0.0);
  std::complex<double>::complex(&local_1ad8,12770.0,0.0);
  std::complex<double>::complex(&local_1ae8,27428.0,0.0);
  std::complex<double>::complex((complex<double> *)&prodAB.data_,29374.0,0.0);
  m10_12._M_value._8_8_ = uVar10;
  m10_12._M_value._0_8_ = uVar9;
  m11_12._M_value._8_8_ = uVar12;
  m11_12._M_value._0_8_ = uVar11;
  m00_14._M_value._8_8_ = extraout_RDX_15;
  m00_14._M_value._0_8_ = pMVar7;
  m01_14._M_value._8_8_ = piVar4;
  m01_14._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1ab8,m00_14,m01_14,m10_12,m11_12);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_56.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator*
            ((dense *)local_1b08,(SquareMatrix<std::complex<double>_> *)&gtest_ar_56.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_56.message_);
  local_1b30 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_1b08);
  local_1b34 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1b28,"prodAB.size()","2",&local_1b30,&local_1b34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b28);
  if (!bVar1) {
    testing::Message::Message(&local_1b40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__29.message_,&local_1b40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_1b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b28);
  local_1b59 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_1b08,
                          (SquareMatrix<std::complex<double>_> *)local_1a18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b58,&local_1b59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b58);
  if (!bVar1) {
    testing::Message::Message(&local_1b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodABC.data_,(internal *)local_1b58,
               (AssertionResult *)"prodAB == prodAB_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b70,&local_1b68);
    testing::internal::AssertHelper::~AssertHelper(&local_1b70);
    std::__cxx11::string::~string((string *)&prodABC.data_);
    testing::Message::~Message(&local_1b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b58);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_57.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator*
            ((dense *)&local_1bb0,(SquareMatrix<std::complex<double>_> *)&gtest_ar_57.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::operator*
            ((dense *)local_1ba0,&local_1bb0,(SquareMatrix<std::complex<double>_> *)local_11d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1bb0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_57.message_);
  local_1bd8 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_1ba0);
  local_1bdc = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1bd0,"prodABC.size()","2",&local_1bd8,&local_1bdc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bd0);
  if (!bVar1) {
    testing::Message::Message(&local_1be8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1bd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__30.message_,&local_1be8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_1be8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bd0);
  local_1c01 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_1ba0,
                          (SquareMatrix<std::complex<double>_> *)local_1a68);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c00,&local_1c01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c00);
  if (!bVar1) {
    testing::Message::Message(&local_1c10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodABCD.data_,(internal *)local_1c00,
               (AssertionResult *)"prodABC == prodABC_check","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c18,&local_1c10);
    testing::internal::AssertHelper::~AssertHelper(&local_1c18);
    std::__cxx11::string::~string((string *)&prodABCD.data_);
    testing::Message::~Message(&local_1c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c00);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_58.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::operator*
            ((dense *)&local_1c68,(SquareMatrix<std::complex<double>_> *)&gtest_ar_58.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::operator*
            ((dense *)&local_1c58,&local_1c68,(SquareMatrix<std::complex<double>_> *)local_11d8);
  qclab::dense::operator*
            ((dense *)local_1c48,&local_1c58,(SquareMatrix<std::complex<double>_> *)local_1228);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1c58);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1c68);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_58.message_);
  local_1c90 = qclab::dense::SquareMatrix<std::complex<double>_>::size
                         ((SquareMatrix<std::complex<double>_> *)local_1c48);
  local_1c94 = 2;
  plVar6 = &local_1c90;
  piVar4 = &local_1c94;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1c88,"prodABCD.size()","2",plVar6,piVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c88);
  if (!bVar1) {
    testing::Message::Message(&local_1ca0);
    piVar4 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_1c88);
    plVar6 = (long *)0xc4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc4,(char *)piVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__31.message_,&local_1ca0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_1ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c88);
  local_1cb9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)local_1c48,
                          (SquareMatrix<std::complex<double>_> *)local_1ab8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1cb8,&local_1cb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cb8);
  if (!bVar1) {
    testing::Message::Message(&local_1cc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prod.data_,(internal *)local_1cb8,
               (AssertionResult *)"prodABCD == prodABCD_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xc5;
    testing::internal::AssertHelper::AssertHelper
              (&local_1cd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc5,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1cd0,&local_1cc8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cd0);
    std::__cxx11::string::~string((string *)&prod.data_);
    testing::Message::~Message(&local_1cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cb8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<double>_> *)local_1188);
  local_1d11 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_,
                          (SquareMatrix<std::complex<double>_> *)local_1a18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d10,&local_1d11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d10);
  if (!bVar1) {
    testing::Message::Message(&local_1d20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_1d10,
               (AssertionResult *)"prod == prodAB_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xc8;
    testing::internal::AssertHelper::AssertHelper
              (&local_1d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,200,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1d28,&local_1d20);
    testing::internal::AssertHelper::~AssertHelper(&local_1d28);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_1d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d10);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<double>_> *)local_11d8);
  local_1d59 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_,
                          (SquareMatrix<std::complex<double>_> *)local_1a68);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d58,&local_1d59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d58);
  if (!bVar1) {
    testing::Message::Message(&local_1d68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_1d58,
               (AssertionResult *)"prod == prodABC_check","false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xc9;
    testing::internal::AssertHelper::AssertHelper
              (&local_1d70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc9,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1d70,&local_1d68);
    testing::internal::AssertHelper::~AssertHelper(&local_1d70);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_1d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d58);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<double>_> *)local_1228);
  local_1da1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_,
                          (SquareMatrix<std::complex<double>_> *)local_1ab8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1da0,&local_1da1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1da0);
  if (!bVar1) {
    testing::Message::Message(&local_1db0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Z.data_,(internal *)local_1da0,(AssertionResult *)"prod == prodABCD_check"
               ,"false","true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xca;
    testing::internal::AssertHelper::AssertHelper
              (&local_1db8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xca,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1db8,&local_1db0);
    testing::internal::AssertHelper::~AssertHelper(&local_1db8);
    std::__cxx11::string::~string((string *)&Z.data_);
    testing::Message::~Message(&local_1db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1da0);
  uVar8 = 2;
  qclab::dense::zeros<std::complex<double>>((int64_t)&Z_check.data_);
  std::complex<double>::complex(&local_1e08,0.0,0.0);
  std::complex<double>::complex(&local_1e18,0.0,0.0);
  std::complex<double>::complex(&local_1e28,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__35.message_,0.0,0.0);
  m10_13._M_value._8_8_ = uVar10;
  m10_13._M_value._0_8_ = uVar9;
  m11_13._M_value._8_8_ = uVar12;
  m11_13._M_value._0_8_ = uVar11;
  m00_15._M_value._8_8_ = extraout_RDX_16;
  m00_15._M_value._0_8_ = uVar8;
  m01_15._M_value._8_8_ = piVar4;
  m01_15._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1df8,m00_15,m01_15,m10_13,m11_13);
  local_1e49 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&Z_check.data_,
                          (SquareMatrix<std::complex<double>_> *)local_1df8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e48,&local_1e49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e48);
  if (!bVar1) {
    testing::Message::Message(&local_1e58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&I.data_,(internal *)local_1e48,(AssertionResult *)"Z == Z_check","false",
               "true",in_R9);
    piVar4 = (int *)std::__cxx11::string::c_str();
    plVar6 = (long *)0xd0;
    testing::internal::AssertHelper::AssertHelper
              (&local_1e60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd0,(char *)piVar4);
    testing::internal::AssertHelper::operator=(&local_1e60,&local_1e58);
    testing::internal::AssertHelper::~AssertHelper(&local_1e60);
    std::__cxx11::string::~string((string *)&I.data_);
    testing::Message::~Message(&local_1e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e48);
  uVar8 = 2;
  qclab::dense::eye<std::complex<double>>((int64_t)&I_check.data_);
  std::complex<double>::complex(&local_1eb0,1.0,0.0);
  std::complex<double>::complex(&local_1ec0,0.0,0.0);
  std::complex<double>::complex(&local_1ed0,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__36.message_,1.0,0.0);
  m10_14._M_value._8_8_ = uVar10;
  m10_14._M_value._0_8_ = uVar9;
  m11_14._M_value._8_8_ = uVar12;
  m11_14._M_value._0_8_ = uVar11;
  m00_16._M_value._8_8_ = extraout_RDX_17;
  m00_16._M_value._0_8_ = uVar8;
  m01_16._M_value._8_8_ = piVar4;
  m01_16._M_value._0_8_ = plVar6;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1ea0,m00_16,m01_16,m10_14,m11_14);
  local_1ef1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                         ((SquareMatrix<std::complex<double>_> *)&I_check.data_,
                          (SquareMatrix<std::complex<double>_> *)local_1ea0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ef0,&local_1ef1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ef0);
  if (!bVar1) {
    testing::Message::Message(&local_1f00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f28,(internal *)local_1ef0,(AssertionResult *)"I == I_check","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f08,&local_1f00);
    testing::internal::AssertHelper::~AssertHelper(&local_1f08);
    std::__cxx11::string::~string((string *)&local_1f28);
    testing::Message::~Message(&local_1f00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ef0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1ea0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&I_check.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1df8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&Z_check.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__32.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1c48);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1ba0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1b08);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1ab8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1a68);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1a18);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__26.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1878);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_17d0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1738);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_16e8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1698);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1648);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__20.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_14a8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1400);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1368);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1318);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_12c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1278);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1228);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_11d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1188);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1138);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_f08);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_46.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_42.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_38.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_420);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_250);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_138);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar.message_);
  return;
}

Assistant:

void test_qclab_dense_SquareMatrix() {

  qclab::dense::SquareMatrix< T >  M1( 3 ) ;
  EXPECT_EQ( M1.size() , 3 ) ;
  EXPECT_EQ( M1.rows() , 3 ) ;
  EXPECT_EQ( M1.cols() , 3 ) ;
  EXPECT_EQ( M1.ld() , 3 ) ;

  int c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      M1(i,j) = c + 0.5 ;
      c++ ;
    }
  }
  c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M1(i,j) , T(c + 0.5) ) ;
      c++ ;
    }
  }

  qclab::dense::SquareMatrix< T >  M2( 3 , 3.14 ) ;
  EXPECT_EQ( M2.size() , 3 ) ;
  EXPECT_EQ( M2.rows() , 3 ) ;
  EXPECT_EQ( M2.cols() , 3 ) ;
  EXPECT_EQ( M2.ld() , 3 ) ;

  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M2(i,j) , T(3.14) ) ;
    }
  }

  qclab::dense::SquareMatrix< T >  M3( 1.0 , 2.0 ,
                                       3.0 , 4.0 ) ;
  EXPECT_EQ( M3.size() , 2 ) ;
  EXPECT_EQ( M3.rows() , 2 ) ;
  EXPECT_EQ( M3.cols() , 2 ) ;
  EXPECT_EQ( M3.ld() , 2 ) ;

  EXPECT_EQ( M3(0,0) , T(1.0) ) ;
  EXPECT_EQ( M3(1,0) , T(3.0) ) ;
  EXPECT_EQ( M3(0,1) , T(2.0) ) ;
  EXPECT_EQ( M3(1,1) , T(4.0) ) ;

  qclab::dense::SquareMatrix< T >  M4(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  7.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_EQ( M4.size() , 4 ) ;
  EXPECT_EQ( M4.rows() , 4 ) ;
  EXPECT_EQ( M4.cols() , 4 ) ;
  EXPECT_EQ( M4.ld() , 4 ) ;

  // column 1
  EXPECT_EQ( M4(0,0) , T( 1.0) ) ;
  EXPECT_EQ( M4(1,0) , T( 5.0) ) ;
  EXPECT_EQ( M4(2,0) , T( 9.0) ) ;
  EXPECT_EQ( M4(3,0) , T(13.0) ) ;
  // column 2
  EXPECT_EQ( M4(0,1) , T( 2.0) ) ;
  EXPECT_EQ( M4(1,1) , T( 6.0) ) ;
  EXPECT_EQ( M4(2,1) , T(10.0) ) ;
  EXPECT_EQ( M4(3,1) , T(14.0) ) ;
  // column 3
  EXPECT_EQ( M4(0,2) , T( 3.0) ) ;
  EXPECT_EQ( M4(1,2) , T( 7.0) ) ;
  EXPECT_EQ( M4(2,2) , T(11.0) ) ;
  EXPECT_EQ( M4(3,2) , T(15.0) ) ;
  // column 4
  EXPECT_EQ( M4(0,3) , T( 4.0) ) ;
  EXPECT_EQ( M4(1,3) , T( 8.0) ) ;
  EXPECT_EQ( M4(2,3) , T(12.0) ) ;
  EXPECT_EQ( M4(3,3) , T(16.0) ) ;

  qclab::dense::SquareMatrix< T >  M4copy( M4 ) ;
  EXPECT_EQ( M4copy.size() , 4 ) ;
  EXPECT_EQ( M4copy.rows() , 4 ) ;
  EXPECT_EQ( M4copy.cols() , 4 ) ;
  EXPECT_EQ( M4copy.ld() , 4 ) ;
  EXPECT_TRUE( M4copy == M4 ) ;

  // operator =
  qclab::dense::SquareMatrix< T >  M1copy ;
  M1copy = M1 ;
  EXPECT_EQ( M1copy.size() , 3 ) ;
  EXPECT_EQ( M1copy.rows() , 3 ) ;
  EXPECT_EQ( M1copy.cols() , 3 ) ;
  EXPECT_EQ( M1copy.ld() , 3 ) ;
  EXPECT_TRUE( M1copy == M1 ) ;

  qclab::dense::SquareMatrix< T >  M2copy( 3 ) ;
  M2copy = M2 ;
  EXPECT_EQ( M2copy.size() , 3 ) ;
  EXPECT_EQ( M2copy.rows() , 3 ) ;
  EXPECT_EQ( M2copy.cols() , 3 ) ;
  EXPECT_EQ( M2copy.ld() , 3 ) ;
  EXPECT_TRUE( M2copy == M2 ) ;

  // operators == and !=
  EXPECT_TRUE( M2 == M2 ) ; EXPECT_FALSE( M2 != M2 ) ;
  EXPECT_TRUE( M3 == M3 ) ; EXPECT_FALSE( M3 != M3 ) ;
  EXPECT_TRUE( M4 == M4 ) ; EXPECT_FALSE( M4 != M4 ) ;
  EXPECT_TRUE( M2 != M3 ) ; EXPECT_FALSE( M2 == M3 ) ;
  EXPECT_TRUE( M3 != M4 ) ; EXPECT_FALSE( M3 == M4 ) ;

  qclab::dense::SquareMatrix< T >  M5(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  0.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_TRUE( M4 != M5 ) ; EXPECT_FALSE( M4 == M5 ) ;
  M5(1,2) = 7.0 ;
  EXPECT_TRUE( M4 == M5 ) ; EXPECT_FALSE( M4 != M5 ) ;

  // operators +=, -=, *=, +, - and *
  qclab::dense::SquareMatrix< T >  A( 1 , 2 ,
                                      3 , 4 ) ;
  qclab::dense::SquareMatrix< T >  B( 5 , 7 ,
                                      6 , 8 ) ;
  qclab::dense::SquareMatrix< T >  C(  9 , 11 ,
                                      10 , 12 ) ;
  qclab::dense::SquareMatrix< T >  D( 13 , 14 ,
                                      15 , 16 ) ;

  qclab::dense::SquareMatrix< T >  sumAB_check(  6 ,  9 ,
                                                 9 , 12 ) ;
  qclab::dense::SquareMatrix< T >  sumABC_check( 15 , 20 ,
                                                 19 , 24 ) ;
  qclab::dense::SquareMatrix< T >  sumABCD_check( 28 , 34 ,
                                                  34 , 40 ) ;

  auto sumAB = A + B ;
  EXPECT_EQ( sumAB.size() , 2 ) ;
  EXPECT_TRUE( sumAB == sumAB_check ) ;

  auto sumABC = A + B + C ;
  EXPECT_EQ( sumABC.size() , 2 ) ;
  EXPECT_TRUE( sumABC == sumABC_check ) ;

  auto sumABCD = A + B + C + D ;
  EXPECT_EQ( sumABCD.size() , 2 ) ;
  EXPECT_TRUE( sumABCD == sumABCD_check ) ;

  auto sum = A ;
  sum += B ;  EXPECT_TRUE( sum == sumAB_check ) ;
  sum += C ;  EXPECT_TRUE( sum == sumABC_check ) ;
  sum += D ;  EXPECT_TRUE( sum == sumABCD_check ) ;

  qclab::dense::SquareMatrix< T >  minusAB_check( -4 , -5 ,
                                                  -3 , -4 ) ;
  qclab::dense::SquareMatrix< T >  minusABC_check( -13 , -16 ,
                                                   -13 , -16 ) ;
  qclab::dense::SquareMatrix< T >  minusABCD_check( -26 , -30 ,
                                                    -28 , -32 ) ;

  auto minusAB = A - B ;
  EXPECT_EQ( minusAB.size() , 2 ) ;
  EXPECT_TRUE( minusAB == minusAB_check ) ;

  auto minusABC = A - B - C ;
  EXPECT_EQ( minusABC.size() , 2 ) ;
  EXPECT_TRUE( minusABC == minusABC_check ) ;

  auto minusABCD = A - B - C - D ;
  EXPECT_EQ( minusABCD.size() , 2 ) ;
  EXPECT_TRUE( minusABCD == minusABCD_check ) ;

  auto minus = A ;
  minus -= B ;  EXPECT_TRUE( minus == minusAB_check ) ;
  minus -= C ;  EXPECT_TRUE( minus == minusABC_check ) ;
  minus -= D ;  EXPECT_TRUE( minus == minusABCD_check ) ;

  qclab::dense::SquareMatrix< T >  prodAB_check( 17 , 23 ,
                                                 39 , 53 ) ;
  qclab::dense::SquareMatrix< T >  prodABC_check( 383 ,  463 ,
                                                  881 , 1065 ) ;
  qclab::dense::SquareMatrix< T >  prodABCD_check( 11924 , 12770 ,
                                                   27428 , 29374 ) ;

  auto prodAB = A * B ;
  EXPECT_EQ( prodAB.size() , 2 ) ;
  EXPECT_TRUE( prodAB == prodAB_check ) ;

  auto prodABC = A * B * C ;
  EXPECT_EQ( prodABC.size() , 2 ) ;
  EXPECT_TRUE( prodABC == prodABC_check ) ;

  auto prodABCD = A * B * C * D ;
  EXPECT_EQ( prodABCD.size() , 2 ) ;
  EXPECT_TRUE( prodABCD == prodABCD_check ) ;

  auto prod = A ;
  prod *= B ;  EXPECT_TRUE( prod == prodAB_check ) ;
  prod *= C ;  EXPECT_TRUE( prod == prodABC_check ) ;
  prod *= D ;  EXPECT_TRUE( prod == prodABCD_check ) ;

  // zeros
  auto Z = qclab::dense::zeros< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  Z_check( 0 , 0 ,
                                            0 , 0 ) ;
  EXPECT_TRUE( Z == Z_check ) ;

  // eye
  auto I = qclab::dense::eye< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  I_check( 1 , 0 ,
                                            0 , 1 ) ;
  EXPECT_TRUE( I == I_check ) ;

}